

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resultvalue.cpp
# Opt level: O1

bool __thiscall ResultValue::operator==(ResultValue *this,ResultValue *rhs)

{
  undefined1 uVar1;
  
  if (this->mType == rhs->mType) {
    uVar1 = (*(code *)(&DAT_0013a8a8 + *(int *)(&DAT_0013a8a8 + (ulong)this->mType * 4)))();
    return (bool)uVar1;
  }
  return false;
}

Assistant:

bool ResultValue::operator==(const ResultValue& rhs) const {
	if (mType == rhs.mType) {
		switch (mType) {
			case ResultValueType::NONE:
				return true;
			case ResultValueType::FLOAT:
				return std::abs(mFloatValue - rhs.mFloatValue) <= EPSILON;
			case ResultValueType::INTEGER:
				return mIntValue == rhs.mIntValue;
			case ResultValueType::COMPLEX:
				return std::abs(mComplexValue.real() - rhs.mComplexValue.real()) <= EPSILON
					&& std::abs(mComplexValue.imag() - rhs.mComplexValue.imag()) <= EPSILON;
		}
	} else {
		return false;
	}
}